

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

problem * __thiscall
baryonyx::affect(problem *__return_storage_ptr__,baryonyx *this,context *ctx,problem *pb,
                int variable_index,bool variable_value)

{
  double dVar1;
  double dVar2;
  double dVar3;
  size_t sVar4;
  undefined8 extraout_RAX;
  int variable_index_00;
  tuple<double,_baryonyx::show_size_type> *mem;
  undefined7 in_register_00000089;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  preprocessor<baryonyx::problem> pp;
  bool local_121;
  undefined4 local_120 [2];
  double local_118;
  undefined1 local_110 [224];
  
  auVar5 = in_ZMM0._0_16_;
  local_121 = SUB41(variable_index,0);
  variable_index_00 = (int)pb;
  if ((-1 < variable_index_00) &&
     (variable_index_00 <
      (int)((ulong)((ctx->parameters).limit - *(long *)&(ctx->parameters).seed) >> 2) * -0x55555555)
     ) {
    dVar1 = (ctx->parameters).init_kappa_improve_increase;
    sVar4 = memory_consumed((problem *)ctx);
    auVar5 = vcvtusi2sd_avx512f(auVar5,sVar4);
    local_118 = auVar5._0_8_;
    dVar2 = local_118 * 0.0009765625;
    dVar3 = dVar2 * 0.0009765625;
    if (dVar3 * 0.0009765625 <= 0.5) {
      if (dVar3 <= 0.5) {
        if (dVar2 <= 0.5) {
          local_120[0] = 3;
        }
        else {
          local_120[0] = 2;
          local_118 = dVar2;
        }
      }
      else {
        local_120[0] = 1;
        local_118 = dVar3;
      }
    }
    else {
      local_120[0] = 0;
      local_118 = dVar3 * 0.0009765625;
    }
    to_string_abi_cxx11_((string *)local_110,(baryonyx *)local_120,mem);
    info<std::basic_string_view<char,std::char_traits<char>>,bool,std::__cxx11::string>
              (this,(context *)
                    "  - Preprocessor starts affectation of variable {} to {} (size: {})\n",
               (char *)(((ulong)pb & 0xffffffff) * 0x10 + (long)dVar1),
               (basic_string_view<char,_std::char_traits<char>_> *)&local_121,(bool *)local_110,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(in_register_00000089,variable_value));
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
    anon_unknown.dwarf_120d51::preprocessor<baryonyx::problem>::preprocessor
              ((preprocessor<baryonyx::problem> *)local_110,(context *)this,(problem *)ctx);
    anon_unknown.dwarf_120d51::preprocessor<baryonyx::problem>::operator()
              (__return_storage_ptr__,(preprocessor<baryonyx::problem> *)local_110,variable_index_00
               ,local_121);
    anon_unknown.dwarf_120d51::preprocessor<baryonyx::problem>::~preprocessor
              ((preprocessor<baryonyx::problem> *)local_110);
    return __return_storage_ptr__;
  }
  affect();
  anon_unknown.dwarf_120d51::preprocessor<baryonyx::problem>::~preprocessor
            ((preprocessor<baryonyx::problem> *)local_110);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

problem
affect(const context& ctx,
       const problem& pb,
       int variable_index,
       bool variable_value)
{
    bx_expects(variable_index >= 0 && variable_index < length(pb.vars.values));

    info(
      ctx,
      "  - Preprocessor starts affectation of variable {} to {} (size: {})\n",
      pb.vars.names[variable_index],
      variable_value,
      to_string(memory_consumed_size(memory_consumed(pb))));

    ::preprocessor<problem> pp(ctx, pb);

    return pp(variable_index, variable_value);
}